

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

void __thiscall QPDFParser::addNull(QPDFParser *this)

{
  int iVar1;
  StackFrame *pSVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_bool>
  pVar3;
  
  if (addNull()::null_obj == '\0') {
    iVar1 = __cxa_guard_acquire(&addNull()::null_obj);
    if (iVar1 != 0) {
      QPDFObject::create<QPDF_Null>();
      __cxa_atexit(std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &addNull::null_obj,&__dso_handle);
      __cxa_guard_release(&addNull()::null_obj);
    }
  }
  pSVar2 = this->frame;
  if (pSVar2->state == st_dictionary_value) {
    pVar3 = std::
            map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
            ::insert_or_assign<std::shared_ptr<QPDFObject>const&>
                      ((map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
                        *)&pSVar2->dict,&pSVar2->key,&addNull::null_obj);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      warnDuplicateKey(this);
    }
    pSVar2 = this->frame;
    pSVar2->state = st_dictionary_key;
  }
  else {
    std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
    emplace_back<std::shared_ptr<QPDFObject>const&>
              ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)pSVar2,
               &addNull::null_obj);
    pSVar2 = this->frame;
  }
  pSVar2->null_count = pSVar2->null_count + 1;
  return;
}

Assistant:

void
QPDFParser::addNull()
{
    const static ObjectPtr null_obj = QPDFObject::create<QPDF_Null>();

    if (frame->state != st_dictionary_value) {
        // If state is st_dictionary_key then there is a missing key. Push onto olist for
        // processing once the tt_dict_close token has been found.
        frame->olist.emplace_back(null_obj);
    } else {
        if (auto res = frame->dict.insert_or_assign(frame->key, null_obj); !res.second) {
            warnDuplicateKey();
        }
        frame->state = st_dictionary_key;
    }
    ++frame->null_count;
}